

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  __m128i m1;
  __m128i m0;
  __m128i m1_acbd;
  __m128i m0_acbd;
  __m128i m1_ac;
  __m128i m0_ac;
  __m128i m_i11;
  __m128i m_i10;
  __m128i m_i01;
  __m128i m_i00;
  int j;
  int i;
  __m128i two_w;
  __m128i one_b;
  __m128i v_maxval;
  __m128i *in_stack_000001a0;
  int in_stack_000001a8;
  int iVar7;
  int iVar8;
  __m128i *m1_00;
  __m128i *m0_00;
  CONV_BUF_TYPE *src1_00;
  CONV_BUF_TYPE *src0_00;
  uint8_t *dst_00;
  
  dst_00 = (uint8_t *)0x40004000400040;
  src1_00 = (CONV_BUF_TYPE *)0x101010101010101;
  src0_00 = (CONV_BUF_TYPE *)0x101010101010101;
  m1_00 = (__m128i *)0x2000200020002;
  m0_00 = (__m128i *)0x2000200020002;
  for (iVar8 = 0; iVar8 < in_stack_00000018; iVar8 = iVar8 + 1) {
    for (iVar7 = 0; iVar7 < (int)m1[0]; iVar7 = iVar7 + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + (iVar7 << 1)));
      xx_loadu_128((void *)(in_stack_00000008 + (iVar7 << 1) + 0x10));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)in_stack_00000010 + (long)(iVar7 << 1)));
      xx_loadu_128((void *)(in_stack_00000008 + (ulong)in_stack_00000010 + (long)(iVar7 << 1) + 0x10
                           ));
      auVar4._8_8_ = extraout_XMM0_Qb;
      auVar4._0_8_ = extraout_XMM0_Qa;
      auVar3._8_8_ = extraout_XMM0_Qb_01;
      auVar3._0_8_ = extraout_XMM0_Qa_01;
      auVar5 = paddusb(auVar4,auVar3);
      auVar2._8_8_ = extraout_XMM0_Qb_00;
      auVar2._0_8_ = extraout_XMM0_Qa_00;
      auVar6._8_8_ = extraout_XMM0_Qb_02;
      auVar6._0_8_ = extraout_XMM0_Qa_02;
      auVar6 = paddusb(auVar2,auVar6);
      auVar1._8_8_ = src0_00;
      auVar1._0_8_ = src1_00;
      pmaddubsw(auVar5,auVar1);
      auVar5._8_8_ = src0_00;
      auVar5._0_8_ = src1_00;
      pmaddubsw(auVar6,auVar5);
      blend_a64_d16_mask_w16_sse41
                (dst_00,src0_00,src1_00,m0_00,m1_00,(__m128i *)CONCAT44(iVar8,iVar7),
                 in_stack_000001a0,in_stack_000001a8);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(in_stack_00000010 << 1);
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i two_w = _mm_set1_epi16(2);
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m_i00 = xx_loadu_128(mask + 2 * j);
      const __m128i m_i01 = xx_loadu_128(mask + 2 * j + 16);
      const __m128i m_i10 = xx_loadu_128(mask + mask_stride + 2 * j);
      const __m128i m_i11 = xx_loadu_128(mask + mask_stride + 2 * j + 16);

      const __m128i m0_ac = _mm_adds_epu8(m_i00, m_i10);
      const __m128i m1_ac = _mm_adds_epu8(m_i01, m_i11);
      const __m128i m0_acbd = _mm_maddubs_epi16(m0_ac, one_b);
      const __m128i m1_acbd = _mm_maddubs_epi16(m1_ac, one_b);
      const __m128i m0 = _mm_srli_epi16(_mm_add_epi16(m0_acbd, two_w), 2);
      const __m128i m1 = _mm_srli_epi16(_mm_add_epi16(m1_acbd, two_w), 2);

      blend_a64_d16_mask_w16_sse41(dst + j, src0 + j, src1 + j, &m0, &m1,
                                   round_offset, &v_maxval, shift);
    }
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}